

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_bytedata.cpp
# Opt level: O1

ByteData * __thiscall
cfd::core::ByteData::SplitData
          (ByteData *__return_storage_ptr__,ByteData *this,uint32_t size_from_top)

{
  initializer_list<unsigned_int> __l;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> ret;
  allocator_type local_45;
  uint32_t local_44;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_40;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_28;
  
  __l._M_len = 1;
  __l._M_array = &local_44;
  local_44 = size_from_top;
  ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_40,__l,&local_45);
  SplitData(&local_28,this,&local_40);
  if (local_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)__return_storage_ptr__,
             &(local_28.
               super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl
               .super__Vector_impl_data._M_start)->data_);
  ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_28);
  return __return_storage_ptr__;
}

Assistant:

ByteData ByteData::SplitData(uint32_t size_from_top) const {
  auto ret = SplitData(std::vector<uint32_t>{size_from_top});
  return ret[0];
}